

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

errr finish_parse_class(parser *p)

{
  player_class *ppVar1;
  uint uVar2;
  player_class *ppVar3;
  
  ppVar1 = (player_class *)parser_priv(p);
  uVar2 = 0xffffffff;
  for (ppVar3 = ppVar1; classes = ppVar1, ppVar3 != (player_class *)0x0; ppVar3 = ppVar3->next) {
    uVar2 = uVar2 + 1;
  }
  while( true ) {
    if (ppVar1 == (player_class *)0x0) {
      parser_destroy(p);
      return 0;
    }
    if (uVar2 == 0xffffffff) break;
    ppVar1->cidx = uVar2;
    ppVar1 = ppVar1->next;
    uVar2 = uVar2 - 1;
  }
  __assert_fail("num",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c",
                0x1026,"errr finish_parse_class(struct parser *)");
}

Assistant:

static errr finish_parse_class(struct parser *p) {
	struct player_class *c;
	int num = 0;
	classes = parser_priv(p);
	for (c = classes; c; c = c->next) num++;
	for (c = classes; c; c = c->next, num--) {
		assert(num);
		c->cidx = num - 1;
	}
	parser_destroy(p);
	return 0;
}